

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_buffered_collector.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalBufferedCollector::Sink
          (PhysicalBufferedCollector *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  pthread_mutex_t *__mutex;
  GlobalSinkState *pGVar1;
  bool bVar2;
  BufferedData *this_00;
  SimpleBufferedData *this_01;
  SinkResultType SVar3;
  InterruptState callback_state;
  InterruptState local_50;
  
  pGVar1 = input->global_state;
  __mutex = (pthread_mutex_t *)(pGVar1 + 1);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  this_00 = shared_ptr<duckdb::BufferedData,_true>::operator->
                      ((shared_ptr<duckdb::BufferedData,_true> *)
                       &pGVar1[1].super_StateWithBlockableTasks.blocked_tasks);
  this_01 = BufferedData::Cast<duckdb::SimpleBufferedData>(this_00);
  bVar2 = SimpleBufferedData::BufferIsFull(this_01);
  if (bVar2) {
    InterruptState::InterruptState(&local_50,input->interrupt_state);
    SimpleBufferedData::BlockSink(this_01,&local_50);
    InterruptState::~InterruptState(&local_50);
    SVar3 = BLOCKED;
  }
  else {
    SimpleBufferedData::Append(this_01,chunk);
    SVar3 = NEED_MORE_INPUT;
  }
  pthread_mutex_unlock(__mutex);
  return SVar3;
}

Assistant:

SinkResultType PhysicalBufferedCollector::Sink(ExecutionContext &context, DataChunk &chunk,
                                               OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<BufferedCollectorGlobalState>();
	auto &lstate = input.local_state.Cast<BufferedCollectorLocalState>();
	(void)lstate;

	lock_guard<mutex> l(gstate.glock);
	auto &buffered_data = gstate.buffered_data->Cast<SimpleBufferedData>();

	if (buffered_data.BufferIsFull()) {
		auto callback_state = input.interrupt_state;
		buffered_data.BlockSink(callback_state);
		return SinkResultType::BLOCKED;
	}
	buffered_data.Append(chunk);
	return SinkResultType::NEED_MORE_INPUT;
}